

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

string * __thiscall
cmFileAPI::ObjectName_abi_cxx11_(string *__return_storage_ptr__,cmFileAPI *this,Object *o)

{
  char *__s;
  string local_50;
  allocator<char> local_1a;
  undefined1 local_19;
  cmFileAPI *local_18;
  Object *o_local;
  string *name;
  
  local_19 = 0;
  local_18 = this;
  o_local = (Object *)__return_storage_ptr__;
  __s = ObjectKindName(*(ObjectKind *)&this->CMakeInstance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_1a)
  ;
  std::allocator<char>::~allocator(&local_1a);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"-v");
  std::__cxx11::to_string(&local_50,*(unsigned_long *)&local_18->APIv1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::ObjectName(Object const& o)
{
  std::string name = ObjectKindName(o.Kind);
  name += "-v";
  name += std::to_string(o.Version);
  return name;
}